

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_specific.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * highwayhash::AvailableCPUs(void)

{
  iterator __position;
  undefined8 in_RAX;
  ThreadAffinity *pTVar1;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t cpu;
  ulong uVar2;
  undefined8 uStack_28;
  
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  std::vector<int,_std::allocator<int>_>::reserve(in_RDI,0x40);
  uVar2 = 0;
  pTVar1 = anon_unknown_0::OriginalThreadAffinity();
  do {
    if (((pTVar1->set).__bits[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
      uStack_28 = CONCAT44((int)uVar2,(undefined4)uStack_28);
      __position._M_current =
           (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (in_RDI,__position,(int *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = (int)uVar2;
        (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x400);
  return in_RDI;
}

Assistant:

std::vector<int> AvailableCPUs() {
  std::vector<int> cpus;
  cpus.reserve(64);
  const ThreadAffinity* const affinity = OriginalThreadAffinity();
#if OS_WIN
  for (int cpu = 0; cpu < 64; ++cpu) {
    if (affinity->mask & (1ULL << cpu)) {
      cpus.push_back(cpu);
    }
  }
#elif OS_LINUX
  for (size_t cpu = 0; cpu < sizeof(cpu_set_t) * 8; ++cpu) {
    if (CPU_ISSET(cpu, &affinity->set)) {
      cpus.push_back(cpu);
    }
  }
#elif OS_FREEBSD
  for (size_t cpu = 0; cpu < sizeof(cpuset_t) * 8; ++cpu) {
    if (CPU_ISSET(cpu, &affinity->set)) {
      cpus.push_back(cpu);
    }
  }
#elif OS_MAC
  for (int cpu = 0; cpu < sizeof(cpu_set_t) * 8; ++cpu) {
    if (CPU_ISSET(cpu, &affinity->set)) {
      cpus.push_back(cpu);
    }
  }
#else
#error "port"
#endif
  return cpus;
}